

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O2

mapped_type * __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::GetOrCreate(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
              *this,key_type k)

{
  value_type entry;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true> _Var1;
  pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18.pointer.ptr = (char *)k.value._8_8_;
  local_18._0_8_ = k.value._0_8_;
  _Var1._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->map)._M_h,(key_type *)&local_18.pointer);
  if (_Var1._M_cur == (__node_type *)0x0) {
    entry.first.value.pointer.ptr = local_18.pointer.ptr;
    entry.first.value._0_8_ = local_18._0_8_;
    entry.second = 0;
    pVar2 = insert(this,entry);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true>
                   ._M_cur;
  }
  return (mapped_type *)
         ((long)&((_Var1._M_cur)->
                 super__Hash_node_value<std::pair<const_duckdb::string_t,_unsigned_long>,_true>).
                 super__Hash_node_value_base<std::pair<const_duckdb::string_t,_unsigned_long>_>.
                 _M_storage._M_storage + 0x10);
}

Assistant:

mapped_type &GetOrCreate(key_type k) {
		auto entry = map.find(k);
		if (entry != map.end()) {
			return entry->second;
		}
		auto result = insert(make_pair(k, mapped_type()));
		return result.first->second;
	}